

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QPersistentModelIndex>::begin(QList<QPersistentModelIndex> *this)

{
  QPersistentModelIndex *n;
  QArrayDataPointer<QPersistentModelIndex> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QPersistentModelIndex> *)0x80aee9);
  QArrayDataPointer<QPersistentModelIndex>::operator->(in_RDI);
  n = QArrayDataPointer<QPersistentModelIndex>::begin
                ((QArrayDataPointer<QPersistentModelIndex> *)0x80aefa);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }